

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O1

iterator __thiscall
llvm::yaml::Scanner::skip_while(Scanner *this,SkipWhileFunc Func,iterator Position)

{
  code *pcVar1;
  iterator pcVar2;
  iterator in_RCX;
  bool bVar3;
  
  do {
    pcVar1 = (code *)Func;
    if ((Func & 1) != 0) {
      pcVar1 = *(code **)(*(long *)(Position + (long)(&this->TokenQueue + -1) + 0x28) + -1 + Func);
    }
    pcVar2 = (iterator)(*pcVar1)(Position + (long)(&this->TokenQueue + -1) + 0x28,in_RCX);
    bVar3 = pcVar2 != in_RCX;
    in_RCX = pcVar2;
  } while (bVar3);
  return pcVar2;
}

Assistant:

StringRef::iterator Scanner::skip_while( SkipWhileFunc Func
                                       , StringRef::iterator Position) {
  while (true) {
    StringRef::iterator i = (this->*Func)(Position);
    if (i == Position)
      break;
    Position = i;
  }
  return Position;
}